

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::ceilF16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<8,_&wasm::Literal::getLanesF16x8,_&wasm::Literal::ceil,_&wasm::toFP16>
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ceilF16x8() const {
  return unary<8, &Literal::getLanesF16x8, &Literal::ceil, &toFP16>(*this);
}